

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

bool __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::Reduce(MI<8UL,_GF2::MOGrevlex<8UL>_> *this,iterator pos)

{
  bool bVar1;
  Geobucket<2UL> *this_00;
  MOGrevlex<8UL> *this_01;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *this_02;
  MM<8UL> *mRight;
  long in_RDI;
  iterator iterPoly;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  MM<8UL> lm;
  bool changed;
  Geobucket<2UL> gb;
  MOGrevlex<8UL> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  byte bVar2;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff08;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  Geobucket<2UL> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  _Self local_98;
  _List_node_base *local_90;
  _Self local_88;
  _Self local_80 [6];
  byte local_4d;
  _Self local_8;
  
  std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
            ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1d02f6);
  MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::Geobucket
            (in_stack_ffffffffffffff30,
             (MP<8UL,_GF2::MOGrevlex<8UL>_> *)
             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
            ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1d0310);
  MP<8UL,_GF2::MOGrevlex<8UL>_>::SetEmpty((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d0318);
  local_4d = 0;
  MM<8UL>::MM((MM<8UL> *)0x1d032f);
  MP<8UL,_GF2::MOGrevlex<8UL>_>::MP
            ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  do {
    bVar1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::PopLM
                      (in_stack_ffffffffffffff30,
                       (MM<8UL> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (!bVar1) {
      bVar2 = local_4d;
      MP<8UL,_GF2::MOGrevlex<8UL>_>::~MP((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d05dd);
      MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::~Geobucket
                ((Geobucket<2UL> *)CONCAT17(bVar2,in_stack_ffffffffffffff00));
      return (bool)(bVar2 & 1);
    }
    local_80[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
         ::begin((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  *)in_stack_fffffffffffffef8);
    while( true ) {
      local_88._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  *)in_stack_fffffffffffffef8);
      bVar1 = std::operator!=(local_80,&local_88);
      if (!bVar1) break;
      bVar1 = std::operator==(local_80,&local_8);
      if (!bVar1) {
        this_00 = (Geobucket<2UL> *)(in_RDI + 0x18);
        std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                  ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1d042f);
        this_01 = (MOGrevlex<8UL> *)
                  MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                            ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        in_stack_ffffffffffffff3c =
             MOGrevlex<8UL>::Compare
                       (this_01,(MM<8UL> *)this_00,
                        (MM<8UL> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        if (0 < in_stack_ffffffffffffff3c) {
          local_90 = (_List_node_base *)
                     std::__cxx11::
                     list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                     ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                            *)in_stack_fffffffffffffef8);
          local_80[0]._M_node = local_90;
          break;
        }
        std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                  ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1d0492);
        in_stack_ffffffffffffff30 =
             (Geobucket<2UL> *)
             MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                       ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                        CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        in_stack_ffffffffffffff2f =
             MM<8ul>::operator|((MM<8UL> *)
                                CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                                (MM<8UL> *)in_stack_fffffffffffffef8);
        if ((bool)in_stack_ffffffffffffff2f) {
          local_4d = 1;
          std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                    ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1d04db);
          this_02 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator=
                              ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                               (MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_fffffffffffffef8);
          MP<8UL,_GF2::MOGrevlex<8UL>_>::PopLM((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d04fc);
          std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                    ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1d050b);
          mRight = MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                             ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                              CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
          in_stack_ffffffffffffff10 =
               (list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
               MM<8UL>::operator/=((MM<8UL> *)in_stack_ffffffffffffff10,
                                   (MM<8UL> *)in_stack_ffffffffffffff08);
          in_stack_ffffffffffffff08 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator*=(this_02,mRight);
          MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::SymDiffSplice
                    (this_00,(MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          break;
        }
      }
      std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(local_80);
    }
    local_98._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
         ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                *)in_stack_fffffffffffffef8);
    bVar1 = std::operator==(local_80,&local_98);
    if (bVar1) {
      std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1d05ac);
      std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
                (in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
    }
  } while( true );
}

Assistant:

bool Reduce(iterator pos)
	{	
		typename MP<_n, _O>::template Geobucket<2> gb(*pos);
		// будем сохранять в *pos остаток
		pos->SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP<_n, _O> poly(_order);
		while (gb.PopLM(lm))
		{
			iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// пропускаем многочлен в позиции pos
				if (iterPoly == pos) continue;
				// все остальное без изменений
				if (_order.Compare(iterPoly->LM(), lm) > 0)
				{
					iterPoly = end();
					break;
				}
				else if (iterPoly->LM() | lm)
				{
					changed = true;
					(poly = *iterPoly).PopLM();
					gb.SymDiffSplice(poly *= (lm /= iterPoly->LM()));
					break;
				}
			}
			if (iterPoly == end()) pos->push_back(lm);
		}
		return changed;
	}